

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test6(void)

{
  bool bVar1;
  int *piVar2;
  int *x;
  pointer piVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_119;
  vector<int,_std::allocator<int>_> v2;
  queue<int> b;
  queue<int> a;
  vector<int,_std::allocator<int>_> v1;
  int local_a8 [36];
  
  CP::queue<int>::queue(&a);
  CP::queue<int>::queue(&b);
  memcpy(local_a8,&DAT_001040bc,0x84);
  __l._M_len = 0x21;
  __l._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&v1,__l,(allocator_type *)&v2);
  local_a8[4] = 4;
  local_a8[5] = 2;
  local_a8[6] = -3;
  local_a8[7] = 9;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 1;
  local_a8[3] = 5;
  local_a8[8] = 6;
  __l_00._M_len = 9;
  __l_00._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&v2,__l_00,&local_119);
  for (piVar3 = v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar3 != v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar3 = piVar3 + 1) {
    CP::queue<int>::push(&a,piVar3);
  }
  for (piVar3 = v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar3 != v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar3 = piVar3 + 1) {
    CP::queue<int>::push(&b,piVar3);
  }
  while( true ) {
    piVar2 = CP::queue<int>::front(&a);
    if (*piVar2 != 0) break;
    CP::queue<int>::pop(&a);
  }
  while( true ) {
    piVar2 = CP::queue<int>::front(&b);
    if (*piVar2 != 0) break;
    CP::queue<int>::pop(&b);
  }
  bVar1 = CP::queue<int>::operator==(&a,&b);
  if (bVar1) {
    bVar1 = CP::queue<int>::operator==(&b,&a);
  }
  else {
    bVar1 = false;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v1.super__Vector_base<int,_std::allocator<int>_>);
  CP::queue<int>::~queue(&b);
  CP::queue<int>::~queue(&a);
  return bVar1;
}

Assistant:

bool test6() {
  CP::queue<int> a,b;
  std::vector<int> v1 = {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1,5,4,2,-3,9,6};
  std::vector<int> v2 = {0,0,1,5,4,2,-3,9,6};
  for (auto &x : v1) { a.push(x); }
  for (auto &x : v2) { b.push(x); }
  while (a.front() == 0) a.pop();
  while (b.front() == 0) b.pop();
  return ( (a == b)   && (b == a) );
}